

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CloseSavepoints(sqlite3 *db)

{
  Savepoint *pTmp;
  Savepoint *p;
  
  p = db->pSavepoint;
  while (p != (Savepoint *)0x0) {
    db->pSavepoint = p->pNext;
    sqlite3DbFreeNN(db,p);
    p = db->pSavepoint;
  }
  db->nSavepoint = 0;
  db->nStatement = 0;
  db->isTransactionSavepoint = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CloseSavepoints(sqlite3 *db){
  while( db->pSavepoint ){
    Savepoint *pTmp = db->pSavepoint;
    db->pSavepoint = pTmp->pNext;
    sqlite3DbFree(db, pTmp);
  }
  db->nSavepoint = 0;
  db->nStatement = 0;
  db->isTransactionSavepoint = 0;
}